

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

void __thiscall
llvm::sys::fs::directory_entry::replace_filename
          (directory_entry *this,Twine *filename,basic_file_status st)

{
  Style in_ECX;
  StringRef SVar1;
  Child local_110;
  ulong local_108;
  string local_f8;
  Twine local_d8;
  SmallString<128U> path;
  
  SVar1.Length = 2;
  SVar1.Data = (char *)(this->Path)._M_string_length;
  SVar1 = sys::path::parent_path((path *)(this->Path)._M_dataplus._M_p,SVar1,in_ECX);
  SmallVector<char,128u>::SmallVector<char_const*,void>
            (&path.super_SmallVector<char,_128U>,SVar1.Data,SVar1.Data + SVar1.Length);
  Twine::Twine((Twine *)&local_f8,"");
  Twine::Twine((Twine *)&local_110,"");
  Twine::Twine(&local_d8,"");
  sys::path::append(&path.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>,filename,
                    (Twine *)&local_f8,(Twine *)&local_110,&local_d8);
  local_108 = (ulong)path.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
                     super_SmallVectorTemplateBase<char,_true>.
                     super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
  local_110.twine =
       (Twine *)path.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
                super_SmallVectorTemplateBase<char,_true>.
                super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
  StringRef::str_abi_cxx11_(&local_f8,(StringRef *)&local_110);
  std::__cxx11::string::operator=((string *)this,(string *)&local_f8);
  std::__cxx11::string::_M_dispose();
  (this->Status).fs_st_size = st.fs_st_size;
  (this->Status).Type = st.Type;
  (this->Status).Perms = st.Perms;
  (this->Status).fs_st_atime_nsec = st.fs_st_atime_nsec;
  (this->Status).fs_st_mtime_nsec = st.fs_st_mtime_nsec;
  (this->Status).fs_st_uid = st.fs_st_uid;
  (this->Status).fs_st_gid = st.fs_st_gid;
  (this->Status).fs_st_atime = st.fs_st_atime;
  (this->Status).fs_st_mtime = st.fs_st_mtime;
  SmallVectorImpl<char>::~SmallVectorImpl
            (&path.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>);
  return;
}

Assistant:

void directory_entry::replace_filename(const Twine &filename,
                                       basic_file_status st) {
  SmallString<128> path = path::parent_path(Path);
  path::append(path, filename);
  Path = path.str();
  Status = st;
}